

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

QList<QString> * __thiscall
QHash<long_long,_QList<QString>_>::value(QHash<long_long,_QList<QString>_> *this,longlong *key)

{
  QList<QString> *pQVar1;
  QList<QString> *in_RDI;
  QList<QString> *v;
  QList<QString> *in_stack_ffffffffffffffc8;
  QList<QString> *pQVar2;
  
  pQVar2 = in_RDI;
  pQVar1 = valueImpl<long_long>((QHash<long_long,_QList<QString>_> *)in_RDI,(longlong *)in_RDI);
  if (pQVar1 == (QList<QString> *)0x0) {
    memset(in_RDI,0,0x18);
    QList<QString>::QList((QList<QString> *)0x17827c);
  }
  else {
    QList<QString>::QList(in_RDI,in_stack_ffffffffffffffc8);
  }
  return pQVar2;
}

Assistant:

T value(const Key &key) const noexcept
    {
        if (T *v = valueImpl(key))
            return *v;
        else
            return T();
    }